

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdjpgcom.c
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  ulong uVar2;
  char *pcVar3;
  char extraout_AL;
  char cVar4;
  int iVar5;
  ushort **ppuVar6;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *pcVar7;
  int iVar8;
  char *pcVar9;
  int raw;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  char cVar13;
  
  progname = *argv;
  if ((progname == (char *)0x0) || (*progname == '\0')) {
    progname = "rdjpgcom";
  }
  pcVar3 = progname;
  iVar8 = 0;
  uVar11 = 1;
  if (argc < 2) {
    raw = 0;
    cVar13 = false;
  }
  else {
    pcVar12 = argv[1];
    cVar13 = true;
    raw = 0;
    if (*pcVar12 == '-') {
      uVar2 = (ulong)(uint)argc;
      uVar11 = 1;
      iVar8 = 0;
      raw = 0;
      pcVar7 = progname;
      do {
        pcVar12 = pcVar12 + 1;
        iVar5 = keymatch(pcVar12,"verbose",(int)pcVar7);
        if (iVar5 == 0) {
          pcVar9 = "raw";
          iVar5 = keymatch(pcVar12,"raw",(int)extraout_RDX);
          raw = 1;
          pcVar7 = extraout_RDX_00;
          if (iVar5 == 0) {
            usage();
            cVar13 = *pcVar12;
            if (cVar13 != '\0') {
              lVar10 = 0;
              cVar4 = cVar13;
              do {
                cVar1 = pcVar9[lVar10];
                if (cVar1 == '\0') {
                  return 0;
                }
                iVar8 = (int)cVar4;
                ppuVar6 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar6 + (long)iVar8 * 2 + 1) & 1) != 0) {
                  iVar8 = tolower(iVar8);
                }
                if (iVar8 != cVar1) {
                  return 0;
                }
                cVar4 = pcVar12[lVar10 + 1];
                lVar10 = lVar10 + 1;
              } while (cVar4 != '\0');
            }
            return (uint)(cVar13 != '\0');
          }
        }
        else {
          iVar8 = iVar8 + 1;
          pcVar7 = extraout_RDX;
        }
        if ((2 - uVar2) + uVar11 == 1) {
          if (uVar2 <= uVar11 + 1) goto LAB_0010149a;
          goto LAB_0010143f;
        }
        pcVar12 = argv[uVar11 + 1];
        uVar11 = uVar11 + 1;
      } while (*pcVar12 == '-');
      cVar13 = uVar11 < uVar2;
    }
  }
  iVar5 = argc + -1;
  argc = (int)uVar11;
  if (argc < iVar5) {
    fprintf(_stderr,"%s: only one input file\n",pcVar3);
    usage();
    cVar13 = extraout_AL;
  }
  if (cVar13 == '\0') {
LAB_0010149a:
    infile = _stdin;
  }
  else {
LAB_0010143f:
    infile = (FILE *)fopen(argv[(uint)argc],"rb");
    if ((FILE *)infile == (FILE *)0x0) {
      fprintf(_stderr,"%s: can\'t open %s\n",progname,argv[(uint)argc]);
      exit(1);
    }
  }
  scan_JPEG_header(iVar8,raw);
  exit(0);
}

Assistant:

int
main(int argc, char **argv)
{
  int argn;
  char *arg;
  int verbose = 0, raw = 0;

  /* On Mac, fetch a command line. */
#ifdef USE_CCOMMAND
  argc = ccommand(&argv);
#endif

  progname = argv[0];
  if (progname == NULL || progname[0] == 0)
    progname = "rdjpgcom";      /* in case C library doesn't provide it */

  /* Parse switches, if any */
  for (argn = 1; argn < argc; argn++) {
    arg = argv[argn];
    if (arg[0] != '-')
      break;                    /* not switch, must be file name */
    arg++;                      /* advance over '-' */
    if (keymatch(arg, "verbose", 1)) {
      verbose++;
    } else if (keymatch(arg, "raw", 1)) {
      raw = 1;
    } else
      usage();
  }

  /* Open the input file. */
  /* Unix style: expect zero or one file name */
  if (argn < argc - 1) {
    fprintf(stderr, "%s: only one input file\n", progname);
    usage();
  }
  if (argn < argc) {
    if ((infile = fopen(argv[argn], READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open %s\n", progname, argv[argn]);
      exit(EXIT_FAILURE);
    }
  } else {
    /* default input file is stdin */
#ifdef USE_SETMODE              /* need to hack file mode? */
    setmode(fileno(stdin), O_BINARY);
#endif
#ifdef USE_FDOPEN               /* need to re-open in binary mode? */
    if ((infile = fdopen(fileno(stdin), READ_BINARY)) == NULL) {
      fprintf(stderr, "%s: can't open stdin\n", progname);
      exit(EXIT_FAILURE);
    }
#else
    infile = stdin;
#endif
  }

  /* Scan the JPEG headers. */
  (void)scan_JPEG_header(verbose, raw);

  /* All done. */
  exit(EXIT_SUCCESS);
  return 0;                     /* suppress no-return-value warnings */
}